

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_pool_2d(ggml_context *ctx,ggml_tensor *a,ggml_op_pool op,int k0,int k1,int s0,int s1,float p0,
            float p1)

{
  ggml_tensor *pgVar1;
  float in_XMM0_Db;
  float in_XMM1_Db;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float in_XMM4_Db;
  long local_58;
  long lStack_50;
  int64_t local_48;
  int64_t iStack_40;
  
  auVar3._0_4_ = (float)s0;
  auVar3._4_4_ = (float)s1;
  auVar3._8_8_ = 0;
  auVar2._0_4_ = (p0 + p0 + (float)a->ne[0]) - (float)k0;
  auVar2._4_4_ = (p1 + p1 + (float)a->ne[1]) - (float)k1;
  auVar2._8_4_ = (in_XMM0_Db + in_XMM0_Db + in_XMM4_Db) - 0.0;
  auVar2._12_4_ = (in_XMM1_Db + in_XMM1_Db + 0.0) - 0.0;
  auVar2 = divps(auVar2,auVar3);
  local_58 = (long)(auVar2._0_4_ + 1.0);
  lStack_50 = (long)(auVar2._4_4_ + 1.0);
  local_48 = a->ne[2];
  iStack_40 = a->ne[3];
  pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_58,(ggml_tensor *)0x0,0);
  if (pgVar1 != (ggml_tensor *)0x0) {
    pgVar1->op_params[0] = op;
    pgVar1->op_params[1] = k0;
    pgVar1->op_params[2] = k1;
    pgVar1->op_params[3] = s0;
    pgVar1->op_params[4] = s1;
    *(ulong *)(pgVar1->op_params + 5) = CONCAT44((int)p1,(int)p0);
    pgVar1->op = GGML_OP_POOL_2D;
    pgVar1->src[0] = a;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-impl.h"
             ,0x70,"GGML_ASSERT(%s) failed","tensor != NULL");
}

Assistant:

struct ggml_tensor * ggml_pool_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        enum ggml_op_pool     op,
        int                   k0,
        int                   k1,
        int                   s0,
        int                   s1,
        float                 p0,
        float                 p1) {
    struct ggml_tensor * result;
    const int64_t ne[4] = {
        ggml_calc_pool_output_size(a->ne[0], k0, s0, p0),
        ggml_calc_pool_output_size(a->ne[1], k1, s1, p1),
        a->ne[2],
        a->ne[3],
    };
    result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { op, k0, k1, s0, s1, p0, p1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_POOL_2D;
    result->src[0] = a;

    return result;
}